

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O0

void __thiscall OPLmusicFile::OPLmusicFile(OPLmusicFile *this,FileReader *reader)

{
  OPLio *pOVar1;
  BYTE *pBVar2;
  int iVar3;
  long lVar4;
  BYTE *pBVar5;
  undefined4 extraout_var;
  int iVar6;
  bool bVar7;
  int local_3c;
  int i;
  BYTE *max;
  int songlen;
  int headersize;
  bool okay;
  FileReader *reader_local;
  OPLmusicFile *this_local;
  
  OPLmusicBlock::OPLmusicBlock(&this->super_OPLmusicBlock);
  (this->super_OPLmusicBlock)._vptr_OPLmusicBlock = (_func_int **)&PTR__OPLmusicFile_009efc08;
  lVar4 = FileReader::GetLength(reader);
  this->ScoreLen = (int)lVar4;
  if ((this->super_OPLmusicBlock).super_musicBlock.io == (OPLio *)0x0) {
    return;
  }
  pBVar5 = (BYTE *)operator_new__((long)this->ScoreLen);
  (this->super_OPLmusicBlock).super_musicBlock.scoredata = pBVar5;
  iVar3 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                    (reader,(this->super_OPLmusicBlock).super_musicBlock.scoredata,
                     (long)this->ScoreLen);
  if (CONCAT44(extraout_var,iVar3) == (long)this->ScoreLen) {
    pOVar1 = (this->super_OPLmusicBlock).super_musicBlock.io;
    iVar3 = (*pOVar1->_vptr_OPLio[2])(pOVar1,(ulong)(uint)(this->super_OPLmusicBlock).NumChips,0);
    (this->super_OPLmusicBlock).NumChips = iVar3;
    if (iVar3 != 0) {
      if ((*(int *)(this->super_OPLmusicBlock).super_musicBlock.scoredata == 0x41574152) &&
         (*(int *)((this->super_OPLmusicBlock).super_musicBlock.scoredata + 4) == 0x41544144)) {
        this->RawPlayer = RDosPlay;
        if (*(short *)((this->super_OPLmusicBlock).super_musicBlock.scoredata + 8) == 0) {
          pBVar5 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
          pBVar5[8] = 0xff;
          pBVar5[9] = 0xff;
        }
        (this->super_OPLmusicBlock).SamplesPerTick =
             (double)*(ushort *)((this->super_OPLmusicBlock).super_musicBlock.scoredata + 8) / 24.0;
      }
      else if ((*(int *)(this->super_OPLmusicBlock).super_musicBlock.scoredata == 0x41524244) &&
              (*(int *)((this->super_OPLmusicBlock).super_musicBlock.scoredata + 4) == 0x4c504f57))
      {
        if (*(short *)((this->super_OPLmusicBlock).super_musicBlock.scoredata + 10) != 1) {
          if (*(int *)((this->super_OPLmusicBlock).super_musicBlock.scoredata + 8) == 2) {
            bVar7 = (this->super_OPLmusicBlock).super_musicBlock.scoredata[0x15] != '\0';
            if (bVar7) {
              Printf("Unsupported DOSBox Raw OPL format %d\n",
                     (ulong)(this->super_OPLmusicBlock).super_musicBlock.scoredata[0x14]);
            }
            songlen._3_1_ = !bVar7;
            if ((this->super_OPLmusicBlock).super_musicBlock.scoredata[0x16] != '\0') {
              Printf("Unsupported DOSBox Raw OPL compression %d\n",
                     (ulong)(this->super_OPLmusicBlock).super_musicBlock.scoredata[0x15]);
              songlen._3_1_ = false;
            }
            if (songlen._3_1_) {
              this->RawPlayer = DosBox2;
              (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
              iVar6 = (this->super_OPLmusicBlock).super_musicBlock.scoredata[0x19] + 0x1a;
              iVar3 = MIN<int>(this->ScoreLen - iVar6,
                               *(int *)((this->super_OPLmusicBlock).super_musicBlock.scoredata + 0xc
                                       ) * 2);
              this->ScoreLen = iVar3 + iVar6;
              goto LAB_0040b67c;
            }
          }
          else {
            pBVar5 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
            Printf("Unsupported DOSBox Raw OPL version %d.%d\n",(ulong)*(ushort *)(pBVar5 + 8),
                   (ulong)*(ushort *)(pBVar5 + 10));
          }
          goto LAB_0040b284;
        }
        this->RawPlayer = DosBox1;
        (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
        iVar3 = MIN<int>(this->ScoreLen + -0x18,
                         *(int *)((this->super_OPLmusicBlock).super_musicBlock.scoredata + 0x10));
        this->ScoreLen = iVar3 + 0x18;
      }
      else {
        if (((*(int *)(this->super_OPLmusicBlock).super_musicBlock.scoredata != 0x494c4441) ||
            ((this->super_OPLmusicBlock).super_musicBlock.scoredata[4] != 'B')) ||
           ((this->super_OPLmusicBlock).super_musicBlock.scoredata[5] != '\x01')) goto LAB_0040b284;
        pBVar5 = (this->super_OPLmusicBlock).super_musicBlock.scoredata + this->ScoreLen;
        this->RawPlayer = IMF;
        (this->super_OPLmusicBlock).SamplesPerTick = 71.02285714285715;
        (this->super_OPLmusicBlock).super_musicBlock.score =
             (this->super_OPLmusicBlock).super_musicBlock.scoredata + 6;
        for (local_3c = 2; local_3c != 0; local_3c = local_3c + -1) {
          do {
            bVar7 = false;
            if ((this->super_OPLmusicBlock).super_musicBlock.score < pBVar5) {
              pBVar2 = (this->super_OPLmusicBlock).super_musicBlock.score;
              (this->super_OPLmusicBlock).super_musicBlock.score = pBVar2 + 1;
              bVar7 = *pBVar2 != '\0';
            }
          } while (bVar7);
        }
        if ((this->super_OPLmusicBlock).super_musicBlock.score < pBVar5) {
          (this->super_OPLmusicBlock).super_musicBlock.score =
               (this->super_OPLmusicBlock).super_musicBlock.score + 1;
        }
        if (pBVar5 < (this->super_OPLmusicBlock).super_musicBlock.score + 8) {
          pBVar5 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
          if (pBVar5 != (BYTE *)0x0) {
            operator_delete__(pBVar5);
          }
          (this->super_OPLmusicBlock).super_musicBlock.scoredata = (BYTE *)0x0;
          return;
        }
        iVar3 = *(int *)(this->super_OPLmusicBlock).super_musicBlock.score;
        if ((iVar3 != 0) &&
           (iVar3 = iVar3 + 4,
           (long)iVar3 <
           (long)this->ScoreLen -
           ((long)(this->super_OPLmusicBlock).super_musicBlock.score -
           (long)(this->super_OPLmusicBlock).super_musicBlock.scoredata))) {
          this->ScoreLen =
               iVar3 + ((int)(this->super_OPLmusicBlock).super_musicBlock.score -
                       (int)(this->super_OPLmusicBlock).super_musicBlock.scoredata);
        }
      }
LAB_0040b67c:
      (*(this->super_OPLmusicBlock)._vptr_OPLmusicBlock[2])();
      return;
    }
  }
LAB_0040b284:
  pBVar5 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
  if (pBVar5 != (BYTE *)0x0) {
    operator_delete__(pBVar5);
  }
  (this->super_OPLmusicBlock).super_musicBlock.scoredata = (BYTE *)0x0;
  return;
}

Assistant:

OPLmusicFile::OPLmusicFile (FileReader *reader)
	: ScoreLen (reader->GetLength())
{
	if (io == NULL)
	{
		return;
	}

	scoredata = new BYTE[ScoreLen];

    if (reader->Read(scoredata, ScoreLen) != ScoreLen)
    {
fail:	delete[] scoredata;
        scoredata = NULL;
        return;
    }

	if (0 == (NumChips = io->OPLinit(NumChips)))
	{
		goto fail;
	}

	// Check for RDosPlay raw OPL format
	if (((DWORD *)scoredata)[0] == MAKE_ID('R','A','W','A') &&
			 ((DWORD *)scoredata)[1] == MAKE_ID('D','A','T','A'))
	{
		RawPlayer = RDosPlay;
		if (*(WORD *)(scoredata + 8) == 0)
		{ // A clock speed of 0 is bad
			*(WORD *)(scoredata + 8) = 0xFFFF; 
		}
		SamplesPerTick = LittleShort(*(WORD *)(scoredata + 8)) / ADLIB_CLOCK_MUL;
	}
	// Check for DosBox OPL dump
	else if (((DWORD *)scoredata)[0] == MAKE_ID('D','B','R','A') &&
		((DWORD *)scoredata)[1] == MAKE_ID('W','O','P','L'))
	{
		if (LittleShort(((WORD *)scoredata)[5]) == 1)
		{
			RawPlayer = DosBox1;
			SamplesPerTick = OPL_SAMPLE_RATE / 1000;
			ScoreLen = MIN<int>(ScoreLen - 24, LittleLong(((DWORD *)scoredata)[4])) + 24;
		}
		else if (((DWORD *)scoredata)[2] == MAKE_ID(2,0,0,0))
		{
			bool okay = true;
			if (scoredata[21] != 0)
			{
				Printf("Unsupported DOSBox Raw OPL format %d\n", scoredata[20]);
				okay = false;
			}
			if (scoredata[22] != 0)
			{
				Printf("Unsupported DOSBox Raw OPL compression %d\n", scoredata[21]);
				okay = false;
			}
			if (!okay)
				goto fail;
			RawPlayer = DosBox2;
			SamplesPerTick = OPL_SAMPLE_RATE / 1000;
			int headersize = 0x1A + scoredata[0x19];
			ScoreLen = MIN<int>(ScoreLen - headersize, LittleLong(((DWORD *)scoredata)[3]) * 2) + headersize;
		}
		else
		{
			Printf("Unsupported DOSBox Raw OPL version %d.%d\n", LittleShort(((WORD *)scoredata)[4]), LittleShort(((WORD *)scoredata)[5]));
			goto fail;
		}
	}
	// Check for modified IMF format (includes a header)
	else if (((DWORD *)scoredata)[0] == MAKE_ID('A','D','L','I') &&
		     scoredata[4] == 'B' && scoredata[5] == 1)
	{
		int songlen;
		BYTE *max = scoredata + ScoreLen;
		RawPlayer = IMF;
		SamplesPerTick = OPL_SAMPLE_RATE / IMF_RATE;

		score = scoredata + 6;
		// Skip track and game name
		for (int i = 2; i != 0; --i)
		{
			while (score < max && *score++ != '\0') {}
		}
		if (score < max) score++;	// Skip unknown byte
		if (score + 8 > max)
		{ // Not enough room left for song data
			delete[] scoredata;
			scoredata = NULL;
			return;
		}
		songlen = LittleLong(*(DWORD *)score);
		if (songlen != 0 && (songlen +=4) < ScoreLen - (score - scoredata))
		{
			ScoreLen = songlen + int(score - scoredata);
		}
	}
	else
	{
		goto fail;
	}

	Restart ();
}